

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O1

string * Test::Private::getFileName(string *__return_storage_ptr__,string *file)

{
  pointer pcVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + file->_M_string_length);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (__return_storage_ptr__,'\\',0xffffffffffffffff);
  if (sVar2 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,__return_storage_ptr__,sVar2 + 1,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (__return_storage_ptr__,'/',0xffffffffffffffff);
  if (sVar2 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,__return_storage_ptr__,sVar2 + 1,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Private::getFileName(const std::string &file) {
  std::string fileName = file;
  std::size_t pos = fileName.find_last_of('\\');
  if (pos != std::string::npos)
    fileName = fileName.substr(pos + 1);
  pos = fileName.find_last_of('/');
  if (pos != std::string::npos)
    fileName = fileName.substr(pos + 1);
  return fileName;
}